

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::addPropertyStarts(Normalizer2Impl *this,USetAdder *sa,UErrorCode *param_2)

{
  uint16_t uVar1;
  uint16_t uVar2;
  UChar32 UVar3;
  int start;
  uint uVar4;
  uint32_t value;
  
  start = 0;
  while( true ) {
    UVar3 = ucptrie_getRange_63(this->normTrie,start,UCPMAP_RANGE_FIXED_LEAD_SURROGATES,1,
                                (UCPMapValueFilter *)0x0,(void *)0x0,&value);
    if (UVar3 < 0) break;
    (*(code *)sa->add)(sa->set,start);
    if ((((start != UVar3) && (2 < (value & 6))) && (this->limitNoNo <= (ushort)value)) &&
       ((ushort)value < this->minMaybeYes)) {
      uVar1 = getFCD16(this,start);
      while (start < UVar3) {
        start = start + 1;
        uVar2 = getFCD16(this,start);
        if (uVar2 != uVar1) {
          (*(code *)sa->add)(sa->set,start);
          uVar1 = uVar2;
        }
      }
    }
    start = UVar3 + 1;
  }
  uVar4 = 0xac00;
  while( true ) {
    uVar4 = uVar4 & 0xffff;
    if (0xd7a3 < uVar4) break;
    (*(code *)sa->add)(sa->set,uVar4);
    (*(code *)sa->add)(sa->set,uVar4 + 1);
    uVar4 = uVar4 + 0x1c;
  }
  (*(code *)sa->add)(sa->set,0xd7a4);
  return;
}

Assistant:

void
Normalizer2Impl::addPropertyStarts(const USetAdder *sa, UErrorCode & /*errorCode*/) const {
    // Add the start code point of each same-value range of the trie.
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(normTrie, start, UCPMAP_RANGE_FIXED_LEAD_SURROGATES, INERT,
                                   nullptr, nullptr, &value)) >= 0) {
        sa->add(sa->set, start);
        if (start != end && isAlgorithmicNoNo((uint16_t)value) &&
                (value & Normalizer2Impl::DELTA_TCCC_MASK) > Normalizer2Impl::DELTA_TCCC_1) {
            // Range of code points with same-norm16-value algorithmic decompositions.
            // They might have different non-zero FCD16 values.
            uint16_t prevFCD16 = getFCD16(start);
            while (++start <= end) {
                uint16_t fcd16 = getFCD16(start);
                if (fcd16 != prevFCD16) {
                    sa->add(sa->set, start);
                    prevFCD16 = fcd16;
                }
            }
        }
        start = end + 1;
    }

    /* add Hangul LV syllables and LV+1 because of skippables */
    for(UChar c=Hangul::HANGUL_BASE; c<Hangul::HANGUL_LIMIT; c+=Hangul::JAMO_T_COUNT) {
        sa->add(sa->set, c);
        sa->add(sa->set, c+1);
    }
    sa->add(sa->set, Hangul::HANGUL_LIMIT); /* add Hangul+1 to continue with other properties */
}